

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_finally.cpp
# Opt level: O0

void __thiscall tst_qpromise_finally::fulfilledSync(tst_qpromise_finally *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  bool local_5e;
  bool local_5d [5];
  int local_58 [4];
  undefined1 *local_48;
  int local_3c;
  QPromise<int> local_38;
  undefined1 local_28 [8];
  QPromise<int> p;
  int value;
  tst_qpromise_finally *this_local;
  
  p.super_QPromiseBase<int>.m_d.d._4_4_ = -1;
  local_3c = 0x2a;
  QtPromise::QPromise<int>::resolve(&local_38,&local_3c);
  local_48 = (undefined1 *)((long)&p.super_QPromiseBase<int>.m_d.d + 4);
  QtPromise::QPromiseBase<int>::finally<tst_qpromise_finally::fulfilledSync()::__0>
            ((QPromiseBase<int> *)local_28,(anon_class_8_1_a8c68091)&local_38);
  QtPromise::QPromise<int>::~QPromise(&local_38);
  local_58[0] = -1;
  iVar3 = waitForValue<int>((QPromise<int> *)local_28,local_58);
  bVar1 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                          ,0x2c);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_5d[0] = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_28);
    local_5e = true;
    bVar2 = QTest::qCompare<bool,bool>
                      (local_5d,&local_5e,"p.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                       ,0x2d);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar1 = QTest::qCompare(p.super_QPromiseBase<int>.m_d.d._4_4_,8,"value","8",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_finally.cpp"
                              ,0x2e);
      if ((bVar1 & 1) == 0) {
        local_5d[1] = true;
        local_5d[2] = false;
        local_5d[3] = false;
        local_5d[4] = false;
      }
      else {
        local_5d[1] = false;
        local_5d[2] = false;
        local_5d[3] = false;
        local_5d[4] = false;
      }
    }
    else {
      local_5d[1] = true;
      local_5d[2] = false;
      local_5d[3] = false;
      local_5d[4] = false;
    }
  }
  else {
    local_5d[1] = true;
    local_5d[2] = false;
    local_5d[3] = false;
    local_5d[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_28);
  return;
}

Assistant:

void tst_qpromise_finally::fulfilledSync()
{
    int value = -1;
    auto p = QtPromise::QPromise<int>::resolve(42).finally([&]() {
        value = 8;
        return 16; // ignored!
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, 8);
}